

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkers.cpp
# Opt level: O0

void snap_to_black_proc(Am_Object *inter,Am_Object *ref_obj,int x,int y,int *out_x,int *out_y)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  Am_Value *pAVar7;
  int local_10c;
  int local_108;
  int jump_index;
  int jump_col;
  int jump_row;
  int col_diff;
  int row_diff;
  int piece_col;
  int piece_row;
  Am_Object local_80;
  Am_Object local_78;
  Am_Object piece_state;
  int rank;
  bool black_player;
  int col;
  int row;
  Am_Object board;
  Am_Object local_40;
  Am_Object window;
  Am_Object piece;
  int *out_y_local;
  int *out_x_local;
  int y_local;
  int x_local;
  Am_Object *ref_obj_local;
  Am_Object *inter_local;
  
  out_x_local._0_4_ = y;
  out_x_local._4_4_ = x;
  _y_local = ref_obj;
  ref_obj_local = inter;
  Am_Object::Get_Owner(&window,(Am_Slot_Flags)inter);
  Am_Object::Am_Object(&local_40);
  pAVar7 = (Am_Value *)Am_Object::Get((ushort)&window,0x68);
  Am_Object::operator=(&local_40,pAVar7);
  Am_Object::Get_Object((ushort)&row,(ulong)&local_40);
  Am_Object::Set((ushort)&window,SUB21(MOVED,0),0);
  Am_Object::Set((ushort)&window,SUB21(JUMPED,0),0);
  *out_x = out_x_local._4_4_;
  *out_y = (int)out_x_local;
  Am_Translate_Coordinates
            ((Am_Object *)_y_local,out_x_local._4_4_,(int)out_x_local,(Am_Object *)&row,
             (int *)((long)&out_x_local + 4),(int *)&out_x_local);
  if ((((out_x_local._4_4_ < 0) || ((int)out_x_local < 0)) || (399 < out_x_local._4_4_)) ||
     (399 < (int)out_x_local)) goto LAB_001050ad;
  uVar3 = ((int)out_x_local + 0x19) / 0x32;
  uVar4 = (out_x_local._4_4_ + 0x19) / 0x32;
  if (((int)uVar3 % 2 == (int)uVar4 % 2) || (Board[(int)(uVar3 * 4 + (int)uVar4 / 2)].piece != 0))
  goto LAB_001050ad;
  pAVar7 = (Am_Value *)Am_Object::Get((ushort)&window,(ulong)BLACK_PLAYER);
  bVar1 = Am_Value::operator_cast_to_bool(pAVar7);
  pAVar7 = (Am_Value *)Am_Object::Get((ushort)&window,0x85);
  piece_state.data._4_4_ = Am_Value::operator_cast_to_int(pAVar7);
  Am_Object::Am_Object(&local_78);
  if (bVar1) {
    Am_Object::Get_Object((ushort)&local_80,0x110320);
    Am_Object::operator=(&local_78,(Am_Object *)&local_80);
    Am_Object::~Am_Object(&local_80);
  }
  else {
    Am_Object::Get_Object((ushort)&piece_col,0x110318);
    Am_Object::operator=(&local_78,(Am_Object *)&piece_col);
    Am_Object::~Am_Object((Am_Object *)&piece_col);
  }
  pAVar7 = (Am_Value *)Am_Object::Get((ushort)&local_78,(ulong)ROW);
  iVar5 = Am_Value::operator_cast_to_int(pAVar7);
  pAVar7 = (Am_Value *)Am_Object::Get((ushort)&local_78,(ulong)COLUMN);
  iVar6 = Am_Value::operator_cast_to_int(pAVar7);
  pAVar7 = (Am_Value *)Am_Object::Get((ushort)&local_78,(ulong)KINGED);
  bVar2 = Am_Value::operator_cast_to_bool(pAVar7);
  if (bVar2) {
LAB_00104e6e:
    if ((int)uVar3 < iVar5) {
      local_108 = iVar5 - uVar3;
    }
    else {
      local_108 = uVar3 - iVar5;
    }
    if ((int)uVar4 < iVar6) {
      local_10c = iVar6 - uVar4;
    }
    else {
      local_10c = uVar4 - iVar6;
    }
    if ((local_108 == local_10c) && (local_108 < 3)) {
      if (local_108 == 1) {
        pAVar7 = (Am_Value *)Am_Object::Get((ushort)&window,(ulong)LAST_JUMPED);
        bVar2 = Am_Value::operator_cast_to_bool(pAVar7);
        if (bVar2) goto LAB_001050a4;
      }
      if (local_108 == 2) {
        iVar5 = ((int)(uVar3 + iVar5) / 2) * 4 + (int)(uVar4 + iVar6) / 4;
        if ((Board[iVar5].piece == 0) || ((bool)(Board[iVar5].black & 1U) == bVar1))
        goto LAB_001050a4;
        Am_Object::Set((ushort)&window,SUB21(JUMPED,0),1);
      }
      *out_x = uVar4 * 0x32;
      *out_y = uVar3 * 0x32;
      Am_Translate_Coordinates((Am_Object *)&row,*out_x,*out_y,(Am_Object *)_y_local,out_x,out_y);
      Am_Object::Set((ushort)&window,SUB21(MOVED,0),1);
      Am_Object::Set((ushort)&window,(uint)ROW,(ulong)uVar3);
      Am_Object::Set((ushort)&window,(uint)COLUMN,(ulong)uVar4);
    }
  }
  else if (bVar1) {
    if (iVar5 < (int)uVar3) goto LAB_00104e6e;
  }
  else if ((int)uVar3 < iVar5) goto LAB_00104e6e;
LAB_001050a4:
  Am_Object::~Am_Object(&local_78);
LAB_001050ad:
  Am_Object::~Am_Object((Am_Object *)&row);
  Am_Object::~Am_Object(&local_40);
  Am_Object::~Am_Object(&window);
  return;
}

Assistant:

Am_Define_Method(Am_Custom_Gridding_Method, void, snap_to_black,
                 (Am_Object inter, const Am_Object &ref_obj, int x, int y,
                  int &out_x, int &out_y))
{
  Am_Object piece = inter.Get_Owner();
  Am_Object window;
  window = piece.Get(Am_WINDOW);
  Am_Object board = window.Get_Object(BOARD);
  piece.Set(MOVED, false);
  piece.Set(JUMPED, false);
  out_x = x;
  out_y = y;
  Am_Translate_Coordinates(ref_obj, x, y, board, x, y);
  if ((x < 0) || (y < 0) || (x >= 400) || (y >= 400))
    return;
  int row, col;
  row = (y + 25) / 50;
  col = (x + 25) / 50;
  if ((row % 2) == (col % 2))
    return;
  if (Board[(row * 4) + (col / 2)].piece)
    return;
  bool black_player = piece.Get(BLACK_PLAYER);
  int rank = piece.Get(Am_RANK);
  Am_Object piece_state;
  if (black_player)
    piece_state = Black_Pieces.Get_Object(piece_slot[rank]);
  else
    piece_state = Red_Pieces.Get_Object(piece_slot[rank]);
  int piece_row = piece_state.Get(ROW);
  int piece_col = piece_state.Get(COLUMN);
  if (!(bool)piece_state.Get(KINGED)) {
    if (black_player) {
      if (row <= piece_row)
        return;
    } else {
      if (row >= piece_row)
        return;
    }
  }
  int row_diff = DIFF(piece_row, row);
  int col_diff = DIFF(piece_col, col);
  if ((row_diff != col_diff) || (row_diff > 2))
    return;
  if ((row_diff == 1) && (bool)piece.Get(LAST_JUMPED))
    return;
  if (row_diff == 2) {
    int jump_row = (row + piece_row) / 2;
    int jump_col = (col + piece_col) / 2;
    int jump_index = (jump_row * 4) + (jump_col / 2);
    if (!Board[jump_index].piece || (Board[jump_index].black == black_player))
      return;
    piece.Set(JUMPED, true);
  }
  out_x = col * 50 /* + (int)inter.Get (Am_X_OFFSET)*/;
  out_y = row * 50 /* + (int)inter.Get (Am_Y_OFFSET)*/;
  Am_Translate_Coordinates(board, out_x, out_y, ref_obj, out_x, out_y);
  piece.Set(MOVED, true);
  piece.Set(ROW, row);
  piece.Set(COLUMN, col);
}